

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynmm.cpp
# Opt level: O3

void __thiscall Dyn_Memory_Manager::~Dyn_Memory_Manager(Dyn_Memory_Manager *this)

{
  Dyn_Link *pDVar1;
  Dyn_Link *pDVar2;
  
  pDVar2 = this->block;
  while (pDVar2 != (Dyn_Link *)0x0) {
    pDVar1 = pDVar2->next;
    operator_delete__(pDVar2);
    pDVar2 = pDVar1;
  }
  this->block = (Dyn_Link *)0x0;
  this->free_list = (Dyn_Link *)0x0;
  return;
}

Assistant:

Dyn_Memory_Manager::~Dyn_Memory_Manager()
{
#ifdef DEBUG
  unsigned int count = 0;
#endif
  Dyn_Link *next;

  // free the allocated blocks
  Dyn_Link *curr = block;
  while (curr != static_cast<Dyn_Link *>(nullptr)) {
#ifdef DEBUG
    ++count;
#endif
    // get the next block
    next = curr->next;

    // delete the actual one; this was a char array
    delete[] curr;

    // ok next
    curr = next;
  }

#ifdef DEBUG
  if (count != blk_count)
    std::cout << "DEBUG:Memory leak in <Dyn_Memory_Manager " << std::hex << this
              << ">, alloc'ed:" << blk_count << ", freed:" << count
              << std::endl;
#endif

  // for safety
  block = static_cast<Dyn_Link *>(nullptr);
  free_list = static_cast<Dyn_Link *>(nullptr);
}